

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

bool lest::search(text *part,text *line)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  text *local_18;
  text *line_local;
  text *part_local;
  
  local_18 = line;
  line_local = part;
  local_30 = (char *)std::__cxx11::string::begin();
  local_28._M_current = local_30;
  local_40 = (char *)std::__cxx11::string::end();
  local_38._M_current = local_40;
  local_50 = (char *)std::__cxx11::string::begin();
  local_48._M_current = local_50;
  local_60 = (char *)std::__cxx11::string::end();
  local_58 = local_60;
  local_20 = std::
             search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bool(*)(char,char)>
                       (local_28,local_38,local_48,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_60,case_insensitive_equal);
  local_68._M_current = (char *)std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_68);
  return bVar1;
}

Assistant:

inline bool search( text part, text line )
    {
        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }